

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant.hpp
# Opt level: O3

rt_expression_interface<double> * __thiscall
viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::substitute
          (rt_constant<long,_viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  int iVar1;
  long lVar2;
  _func_int **pp_Var3;
  undefined4 extraout_var;
  ulong uVar4;
  
  lVar2 = *(long *)e;
  if (*(long *)(e + 8) != lVar2) {
    uVar4 = 0;
    do {
      iVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                        (this,*(undefined8 *)(lVar2 + uVar4 * 8));
      if ((char)iVar1 != '\0') {
        this = *(rt_constant<long,_viennamath::rt_expression_interface<double>_> **)
                (*(long *)repl + uVar4 * 8);
        pp_Var3 = (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface;
        goto LAB_00106224;
      }
      uVar4 = uVar4 + 1;
      lVar2 = *(long *)e;
    } while (uVar4 < (ulong)(*(long *)(e + 8) - lVar2 >> 3));
  }
  pp_Var3 = (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface;
LAB_00106224:
  iVar1 = (*pp_Var3[2])(this);
  return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        //std::cout << "Comparing variable<" << id << "> with " << e->str() << ", result: ";
        for (size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        //std::cout << "FALSE" << std::endl;
        return clone();
      }